

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  int i;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ChannelType CVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Texture1DView TVar33;
  Vec4 uq;
  Vector<float,_4> res_1;
  Vec3 triS [2];
  Vector<float,_4> res_4;
  Vector<float,_4> res;
  float triLod [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  IVec2 dstSize;
  Vec4 sq;
  Texture1DView view;
  float local_15c;
  ConstPixelBufferAccess local_158;
  Vec3 local_128;
  Vec3 local_11c;
  IVec2 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float local_e4;
  float local_dc;
  undefined1 local_d8 [16];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_c8;
  IVec2 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_70 [4];
  Texture1DView local_60;
  IVec2 local_50;
  undefined1 local_48 [16];
  
  iVar19 = params->baseLevel;
  iVar14 = src->m_numLevels + -1;
  iVar11 = iVar14;
  if (iVar19 < iVar14) {
    iVar11 = iVar19;
  }
  iVar18 = 0;
  if (-1 < iVar19) {
    iVar18 = iVar11;
  }
  iVar19 = params->maxLevel;
  if (iVar19 < iVar14) {
    iVar14 = iVar19;
  }
  local_60.m_numLevels = 1;
  if (iVar18 <= iVar19) {
    local_60.m_numLevels = (iVar14 - iVar18) + 1;
  }
  local_60.m_levels = src->m_levels + iVar18;
  fVar24 = *texCoord;
  fVar23 = texCoord[1];
  local_70[2] = texCoord[2];
  local_70[3] = texCoord[3];
  local_88._0_4_ = local_70[2];
  local_98._0_4_ = local_70[3];
  sampler = &params->sampler;
  local_70[0] = fVar24;
  local_70[1] = fVar23;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar33 = tcu::getEffectiveTextureView(&local_60,&local_c8,sampler);
    uVar10 = TVar33.m_numLevels;
    fVar22 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      fVar22 = (params->super_RenderParams).bias;
    }
    local_a8.m_data[0] = dst->m_width;
    local_a8.m_data[1] = dst->m_height;
    if ((int)uVar10 < 1) {
      iVar19 = 0;
    }
    else {
      iVar19 = ((TVar33.m_levels)->m_size).m_data[0];
    }
    local_128.m_data[2] = (float)local_88._0_4_;
    local_11c.m_data[0] = (float)local_98._0_4_;
    local_11c.m_data[1] = (float)local_88._0_4_;
    local_128.m_data[0] = fVar24;
    local_128.m_data[1] = fVar23;
    local_11c.m_data[2] = fVar23;
    fVar23 = computeNonProjectedTriLod(params->lodMode,&local_a8,iVar19,&local_128);
    fVar23 = fVar23 + fVar22;
    fVar24 = params->maxLod;
    if (fVar23 <= params->maxLod) {
      fVar24 = fVar23;
    }
    uVar20 = -(uint)(fVar23 < params->minLod);
    local_d8._0_4_ = uVar20 & (uint)params->minLod | ~uVar20 & (uint)fVar24;
    fVar23 = computeNonProjectedTriLod(params->lodMode,&local_a8,iVar19,&local_11c);
    fVar23 = fVar23 + fVar22;
    fVar24 = params->maxLod;
    if (fVar23 <= params->maxLod) {
      fVar24 = fVar23;
    }
    CVar21 = -(uint)(fVar23 < params->minLod);
    local_d8._4_4_ = CVar21 & (uint)params->minLod | ~CVar21 & (uint)fVar24;
    if (0 < dst->m_height) {
      iVar19 = 0;
      do {
        iVar11 = dst->m_width;
        if (0 < iVar11) {
          iVar14 = 0;
          do {
            fVar24 = ((float)iVar19 + 0.5) / (float)dst->m_height;
            fVar23 = ((float)iVar14 + 0.5) / (float)iVar11;
            bVar8 = 1.0 <= fVar23 + fVar24;
            if (bVar8) {
              fVar23 = 1.0 - fVar23;
              fVar24 = 1.0 - fVar24;
            }
            uVar9 = (ulong)bVar8;
            fVar22 = (&local_128)[uVar9].m_data[0];
            fVar24 = ((&local_128)[uVar9].m_data[1] - fVar22) * fVar24 +
                     ((&local_11c)[uVar9 - 1].m_data[2] - fVar22) * fVar23 + fVar22;
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_108.m_data[0] = 0;
              local_108.m_data[1] = 0;
              local_158.m_format.order =
                   (ChannelOrder)
                   tcu::sampleLevelArray1DCompare
                             (TVar33.m_levels,uVar10,sampler,(params->super_RenderParams).ref,fVar24
                              ,*(float *)(local_d8 + uVar9 * 4),&local_108);
              local_158.m_format.type = SNORM_INT8;
              local_158.m_size.m_data[0] = 0;
              local_158.m_size.m_data[1] = 0x3f800000;
            }
            else {
              tcu::sampleLevelArray1D
                        (&local_158,(int)TVar33.m_levels,(Sampler *)(ulong)uVar10,fVar24,
                         (int)sampler,*(float *)(local_d8 + uVar9 * 4));
            }
            local_f8 = 0;
            uStack_f0 = 0;
            lVar13 = 0;
            do {
              *(float *)((long)&local_f8 + lVar13 * 4) =
                   (float)local_158.m_size.m_data[lVar13 + -2] *
                   (params->super_RenderParams).colorScale.m_data[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            local_158.m_size.m_data[2] = 0;
            local_158.m_pitch.m_data[0] = 0;
            local_158.m_pitch.m_data[1] = 0;
            local_158.m_pitch.m_data[2] = 0;
            lVar13 = 0;
            do {
              local_158.m_size.m_data[lVar13 + 2] =
                   (int)(*(float *)((long)&local_f8 + lVar13 * 4) +
                        (params->super_RenderParams).colorBias.m_data[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            bVar7 = dst->m_colorMask;
            uVar12 = 0;
            uVar20 = 0;
            if ((bVar7 & 1) != 0) {
              uVar15 = 0x7e - (local_158.m_size.m_data[2] >> 0x17);
              uVar20 = ((local_158.m_size.m_data[2] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar20 = uVar15;
              }
              uVar20 = uVar20 >> 0x18;
            }
            if ((bVar7 & 2) != 0) {
              uVar15 = 0x7e - (local_158.m_pitch.m_data[0] >> 0x17);
              uVar12 = ((local_158.m_pitch.m_data[0] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar12 = uVar15;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar15 = 0;
            if ((bVar7 & 4) != 0) {
              uVar16 = 0x7e - (local_158.m_pitch.m_data[1] >> 0x17);
              uVar15 = ((local_158.m_pitch.m_data[1] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar16 & 0x1f)) + 0x800000;
              if (8 < uVar16) {
                uVar15 = uVar16;
              }
              uVar15 = uVar15 >> 8 & 0xff0000;
            }
            uVar16 = 0xff000000;
            if ((bVar7 & 8) != 0) {
              uVar17 = 0x7e - (local_158.m_pitch.m_data[2] >> 0x17);
              uVar16 = ((local_158.m_pitch.m_data[2] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar17 & 0x1f)) + 0x800000;
              if (8 < uVar17) {
                uVar16 = uVar17;
              }
              uVar16 = uVar16 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar14) * 4)
                 = uVar12 | uVar20 | uVar15 | uVar16;
            iVar14 = iVar14 + 1;
            iVar11 = dst->m_width;
          } while (iVar14 < iVar11);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < dst->m_height);
    }
  }
  else {
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar33 = tcu::getEffectiveTextureView(&local_60,&local_c8,sampler);
    uVar10 = TVar33.m_numLevels;
    fVar22 = 0.0;
    local_15c = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_15c = (params->super_RenderParams).bias;
    }
    iVar19 = dst->m_height;
    if (0 < (int)uVar10) {
      fVar22 = (float)((TVar33.m_levels)->m_size).m_data[0];
    }
    iVar11 = dst->m_width;
    local_dc = (float)iVar19;
    local_158.m_format.order = R;
    local_158.m_format.type = SNORM_INT8;
    local_158.m_size.m_data[0] = 0;
    local_158.m_size.m_data[1] = 0;
    lVar13 = 0;
    do {
      local_158.m_size.m_data[lVar13 + -2] = (int)(local_70[lVar13] * fVar22);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_128.m_data[0] = fVar24;
    local_128.m_data[1] = fVar23;
    local_128.m_data[2] = (float)local_88._0_4_;
    local_11c.m_data[0] = (float)local_98._0_4_;
    local_11c.m_data[1] = (float)local_88._0_4_;
    local_11c.m_data[2] = fVar23;
    local_158.m_pitch.m_data[0] = local_158.m_format.type;
    local_158.m_size.m_data[2] = local_158.m_format.order;
    local_158.m_pitch.m_data[2] = local_158.m_size.m_data[1];
    local_158.m_pitch.m_data[1] = local_158.m_size.m_data[0];
    local_158.m_data._0_4_ = local_158.m_size.m_data[0];
    local_158.m_data._4_4_ = local_158.m_format.type;
    pfVar1 = (params->super_RenderParams).w.m_data + 2;
    local_f8 = *(undefined8 *)(params->super_RenderParams).w.m_data;
    uStack_f0 = *(undefined8 *)pfVar1;
    local_e8 = *pfVar1;
    local_e4 = (params->super_RenderParams).w.m_data[1];
    if (0 < iVar19) {
      iVar19 = 0;
      do {
        iVar14 = dst->m_width;
        if (0 < iVar14) {
          fVar24 = (float)iVar19 + 0.5;
          fVar23 = fVar24 / local_dc;
          local_88 = ZEXT416((uint)fVar23);
          local_98 = ZEXT416((uint)fVar24);
          local_48 = ZEXT416((uint)(local_dc - fVar24));
          iVar18 = 0;
          do {
            fVar26 = (float)iVar18 + 0.5;
            fVar22 = fVar26 / (float)iVar11;
            fVar28 = (float)local_88._0_4_ + fVar22;
            bVar8 = 1.0 <= fVar28;
            fVar24 = (float)local_88._0_4_;
            if (bVar8) {
              fVar22 = 1.0 - fVar22;
              fVar24 = 1.0 - fVar23;
            }
            lVar13 = (ulong)((uint)bVar8 * 4) * 3;
            fVar2 = *(float *)((long)&local_f8 + lVar13);
            fVar3 = *(float *)((long)&local_f8 + lVar13 + 4);
            fVar4 = *(float *)((long)&uStack_f0 + lVar13);
            fVar27 = 0.0;
            if (params->lodMode < LODMODE_LAST) {
              fVar27 = (float)(~-(uint)(1.0 <= fVar28) & local_98._0_4_ |
                              -(uint)(1.0 <= fVar28) & local_48._0_4_);
              if (1.0 <= fVar28) {
                fVar26 = (float)iVar11 - fVar26;
              }
              fVar25 = (float)dst->m_height;
              fVar29 = (float)iVar14;
              fVar30 = fVar2 * fVar3 * fVar4;
              fVar28 = (float)(&local_158.m_pitch)[(ulong)bVar8 - 1].m_data[2];
              fVar5 = (float)(&local_158.m_pitch)[bVar8].m_data[0];
              fVar31 = fVar26 / fVar29;
              fVar6 = (float)(&local_158.m_pitch)[bVar8].m_data[1];
              fVar32 = ((fVar31 + -1.0) * fVar25 + fVar27) * fVar3 * fVar4 -
                       (fVar3 * fVar25 * fVar31 + fVar27 * fVar4) * fVar2;
              fVar31 = (((fVar28 - fVar5) * fVar4 * (fVar31 + -1.0) +
                        ((fVar5 - fVar6) * fVar2 + (fVar6 - fVar28) * fVar3) * fVar31) *
                       fVar30 * fVar25) / (fVar32 * fVar32);
              fVar27 = fVar27 / fVar25;
              fVar26 = ((fVar27 + -1.0) * fVar29 + fVar26) * fVar3 * fVar4 -
                       (fVar29 * fVar4 * fVar27 + fVar26 * fVar3) * fVar2;
              fVar26 = (((fVar28 - fVar6) * fVar3 * (fVar27 + -1.0) +
                        ((fVar5 - fVar28) * fVar4 + (fVar6 - fVar5) * fVar2) * fVar27) *
                       fVar30 * fVar29) / (fVar26 * fVar26);
              uVar20 = -(uint)(-fVar26 <= fVar26);
              fVar26 = (float)(~uVar20 & (uint)-fVar26 | (uint)fVar26 & uVar20);
              uVar20 = -(uint)(-fVar31 <= fVar31);
              fVar28 = (float)(~uVar20 & (uint)-fVar31 | (uint)fVar31 & uVar20);
              uVar20 = -(uint)(fVar28 <= fVar26);
              fVar27 = (float)(~uVar20 & (uint)fVar28 | uVar20 & (uint)fVar26);
            }
            fVar26 = (1.0 - fVar22) - fVar24;
            fVar22 = ((*(float *)((long)local_11c.m_data + lVar13 + -4) * fVar22) / fVar4 +
                     (*(float *)((long)local_128.m_data + lVar13 + 4) * fVar24) / fVar3 +
                     (*(float *)((long)local_128.m_data + lVar13) * fVar26) / fVar2) /
                     (fVar22 / fVar4 + fVar24 / fVar3 + fVar26 / fVar2);
            fVar24 = logf(fVar27);
            fVar24 = fVar24 * 1.442695 + local_15c;
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_50.m_data[0] = 0;
              local_50.m_data[1] = 0;
              local_d8._0_4_ =
                   tcu::sampleLevelArray1DCompare
                             (TVar33.m_levels,uVar10,sampler,(params->super_RenderParams).ref,fVar22
                              ,fVar24,&local_50);
              local_d8._4_4_ = SNORM_INT8;
              local_d8._8_4_ = 0;
              local_d8._12_4_ = 0x3f800000;
            }
            else {
              tcu::sampleLevelArray1D
                        ((ConstPixelBufferAccess *)local_d8,(int)TVar33.m_levels,
                         (Sampler *)(ulong)uVar10,fVar22,(int)sampler,fVar24);
            }
            local_a8.m_data[0] = 0;
            local_a8.m_data[1] = 0;
            uStack_a0 = 0;
            lVar13 = 0;
            do {
              local_a8.m_data[lVar13] =
                   (int)(*(float *)(local_d8 + lVar13 * 4) *
                        (params->super_RenderParams).colorScale.m_data[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            local_108.m_data[0] = 0;
            local_108.m_data[1] = 0;
            uStack_100 = 0;
            lVar13 = 0;
            do {
              local_108.m_data[lVar13] =
                   (int)((float)local_a8.m_data[lVar13] +
                        (params->super_RenderParams).colorBias.m_data[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            bVar7 = dst->m_colorMask;
            uVar12 = 0;
            uVar20 = 0;
            if ((bVar7 & 1) != 0) {
              uVar15 = 0x7e - (local_108.m_data[0] >> 0x17);
              uVar20 = ((local_108.m_data[0] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar20 = uVar15;
              }
              uVar20 = uVar20 >> 0x18;
            }
            if ((bVar7 & 2) != 0) {
              uVar15 = 0x7e - (local_108.m_data[1] >> 0x17);
              uVar12 = ((local_108.m_data[1] & 0x7fffffU) * 0xff + 0x7f800000 >>
                       ((byte)uVar15 & 0x1f)) + 0x800000;
              if (8 < uVar15) {
                uVar12 = uVar15;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar15 = 0;
            if ((bVar7 & 4) != 0) {
              uVar16 = 0x7e - ((int)(uint)uStack_100 >> 0x17);
              uVar15 = (((uint)uStack_100 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f))
                       + 0x800000;
              if (8 < uVar16) {
                uVar15 = uVar16;
              }
              uVar15 = uVar15 >> 8 & 0xff0000;
            }
            uVar16 = 0xff000000;
            if ((bVar7 & 8) != 0) {
              uVar17 = 0x7e - ((int)uStack_100._4_4_ >> 0x17);
              uVar16 = ((uStack_100._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f))
                       + 0x800000;
              if (8 < uVar17) {
                uVar16 = uVar17;
              }
              uVar16 = uVar16 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar18) * 4)
                 = uVar12 | uVar20 | uVar15 | uVar16;
            iVar18 = iVar18 + 1;
            iVar14 = dst->m_width;
          } while (iVar18 < iVar14);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < dst->m_height);
    }
  }
  if (local_c8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture1DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, params);
	else
		sampleTextureNonProjected(dst, view, sq, params);
}